

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O2

string * AddLineNumber(string *__return_storage_ptr__,string *s,uint64_t line,string *prefix)

{
  ostringstream local_1a0 [376];
  
  if (line == 0xffffffffffffffff) {
    std::operator+(__return_storage_ptr__,prefix,s);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::operator<<((ostream *)local_1a0,(string *)prefix);
    std::operator<<((ostream *)local_1a0,"(line ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::operator<<((ostream *)local_1a0,") ");
    std::operator<<((ostream *)local_1a0,(string *)s);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AddLineNumber(const std::string& s,uint64_t line /*= LINE_NOT_SPECIFIED*/, const std::string& prefix = "")
{
    return line == STEP::SyntaxError::LINE_NOT_SPECIFIED ? prefix+s : static_cast<std::string>( (Formatter::format(),prefix,"(line ",line,") ",s) );
}